

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O2

void __thiscall ui::Led::FetchState(Led *this)

{
  istream *piVar1;
  ulong uVar2;
  ulong uVar3;
  string trigger;
  string entry;
  string local_3d8 [32];
  stringstream ss;
  ifstream file;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                 &this->file_path_,"/brightness");
  std::ifstream::ifstream(&file,(string *)&ss,_S_in);
  std::istream::operator>>(&file,&this->brightness_);
  std::ifstream::~ifstream(&file);
  std::__cxx11::string::~string((string *)&ss);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->trigger_entries_);
  this->trigger_selected_ = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                 &this->file_path_,"/trigger");
  std::ifstream::ifstream(&file,(string *)&ss,_S_in);
  std::__cxx11::string::~string((string *)&ss);
  trigger._M_dataplus._M_p = (pointer)&trigger.field_2;
  trigger._M_string_length = 0;
  trigger.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&file,(string *)&trigger);
  entry._M_dataplus._M_p = (pointer)&entry.field_2;
  entry._M_string_length = 0;
  entry.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&trigger,_S_out|_S_in);
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ss,(string *)&entry,' ');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    if (*entry._M_dataplus._M_p == '[') {
      this->trigger_selected_ =
           (int)((ulong)((long)(this->trigger_entries_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->trigger_entries_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->trigger_entries_,&entry);
  }
  uVar2 = std::__cxx11::string::find((char)&trigger,0x5b);
  uVar3 = std::__cxx11::string::find((char)&trigger,0x5d);
  if (uVar3 == 0xffffffffffffffff || uVar3 <= uVar2) {
    std::__cxx11::string::assign((char *)&this->trigger_);
  }
  else {
    std::__cxx11::string::substr((ulong)local_3d8,(ulong)&trigger);
    std::__cxx11::string::operator=((string *)&this->trigger_,local_3d8);
    std::__cxx11::string::~string(local_3d8);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&entry);
  std::__cxx11::string::~string((string *)&trigger);
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

void FetchState() {
    std::ifstream(file_path_ + "/brightness") >> brightness_;
    trigger_entries_.clear();
    trigger_selected_ = 0;

    std::ifstream file(file_path_ + "/trigger");
    std::string trigger;
    std::getline(file, trigger);

    std::string entry;
    std::stringstream ss(trigger);
    while (std::getline(ss, entry, ' ')) {
      if (entry.front() == '[')
        trigger_selected_ = trigger_entries_.size();
      trigger_entries_.push_back(entry);
    }

    size_t left = trigger.find('[');
    size_t right = trigger.find(']');
    if (left < right && left != std::string::npos && right != std::string::npos)
      trigger_ = trigger.substr(left + 1, right - left - 1);
    else
      trigger_ = "error";
  }